

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderTextEllipsis
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,float clip_max_x,
               float ellipsis_max_x,char *text,char *text_end_full,ImVec2 *text_size_if_known)

{
  ImVec2 *pIVar1;
  ImFont *this;
  int iVar2;
  ImU32 col;
  float fVar3;
  bool local_e1;
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImVec2 local_c4;
  int local_bc;
  float local_b8;
  int i;
  float ellipsis_x;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  float local_8c;
  float local_88;
  float text_size_clipped_x;
  float text_avail_width;
  float spacing_between_dots;
  float ellipsis_total_width;
  float ellipsis_glyph_width;
  ImFontGlyph *glyph;
  int ellipsis_char_count;
  ImWchar ellipsis_char;
  char *text_end_ellipsis;
  ImFont *pIStack_58;
  float font_size;
  ImFont *font;
  ImVec2 text_size;
  ImGuiContext *g;
  ImVec2 *text_size_if_known_local;
  char *text_end_full_local;
  char *text_local;
  float ellipsis_max_x_local;
  float clip_max_x_local;
  ImVec2 *pos_max_local;
  ImVec2 *pos_min_local;
  ImDrawList *draw_list_local;
  
  text_size = (ImVec2)GImGui;
  text_size_if_known_local = (ImVec2 *)text_end_full;
  if (text_end_full == (char *)0x0) {
    text_size_if_known_local = (ImVec2 *)FindRenderedTextEnd(text,(char *)0x0);
  }
  if (text_size_if_known == (ImVec2 *)0x0) {
    font = (ImFont *)CalcTextSize(text,(char *)text_size_if_known_local,false,0.0);
  }
  else {
    font = *(ImFont **)text_size_if_known;
  }
  if (font._0_4_ <= pos_max->x - pos_min->x) {
    ImVec2::ImVec2(&local_cc,clip_max_x,pos_max->y);
    ImVec2::ImVec2(&local_d4,0.0,0.0);
    RenderTextClippedEx(draw_list,pos_min,&local_cc,text,(char *)text_size_if_known_local,
                        (ImVec2 *)&font,&local_d4,(ImRect *)0x0);
  }
  else {
    pIStack_58 = draw_list->_Data->Font;
    text_end_ellipsis._4_4_ = draw_list->_Data->FontSize;
    _ellipsis_char_count = (ImVec2 *)0x0;
    glyph._6_2_ = pIStack_58->EllipsisChar;
    glyph._0_4_ = 1;
    if (glyph._6_2_ == 0xffff) {
      glyph._6_2_ = 0x2e;
      glyph._0_4_ = 3;
    }
    _ellipsis_total_width = ImFont::FindGlyph(pIStack_58,glyph._6_2_);
    text_avail_width = _ellipsis_total_width->X1;
    spacing_between_dots = text_avail_width;
    if (1 < (int)glyph) {
      text_size_clipped_x = (draw_list->_Data->FontSize / pIStack_58->FontSize) * 1.0;
      spacing_between_dots =
           (_ellipsis_total_width->X1 - _ellipsis_total_width->X0) + text_size_clipped_x;
      text_avail_width = spacing_between_dots * (float)(int)glyph + -text_size_clipped_x;
    }
    fVar3 = ImMax<float>(pos_max->x,ellipsis_max_x);
    local_88 = ImMax<float>((fVar3 - text_avail_width) - pos_min->x,1.0);
    local_94 = ImFont::CalcTextSizeA
                         (pIStack_58,text_end_ellipsis._4_4_,local_88,0.0,text,
                          (char *)text_size_if_known_local,(char **)&ellipsis_char_count);
    local_8c = local_94.x;
    if (((ImVec2 *)text == _ellipsis_char_count) &&
       (_ellipsis_char_count < text_size_if_known_local)) {
      iVar2 = ImTextCountUtf8BytesFromChar(text,(char *)text_size_if_known_local);
      _ellipsis_char_count = (ImVec2 *)(text + iVar2);
      local_9c = ImFont::CalcTextSizeA
                           (pIStack_58,text_end_ellipsis._4_4_,3.4028235e+38,0.0,text,
                            (char *)_ellipsis_char_count,(char **)0x0);
      local_8c = local_9c.x;
    }
    while( true ) {
      local_e1 = false;
      if (text < _ellipsis_char_count) {
        local_e1 = ImCharIsBlankA(*(char *)((long)&_ellipsis_char_count[-1].y + 3));
      }
      pIVar1 = _ellipsis_char_count;
      if (local_e1 == false) break;
      _ellipsis_char_count = (ImVec2 *)((long)&_ellipsis_char_count[-1].y + 3);
      local_a4 = ImFont::CalcTextSizeA
                           (pIStack_58,text_end_ellipsis._4_4_,3.4028235e+38,0.0,
                            (char *)_ellipsis_char_count,(char *)pIVar1,(char **)0x0);
      local_8c = local_8c - local_a4.x;
    }
    ImVec2::ImVec2(&local_ac,clip_max_x,pos_max->y);
    pIVar1 = _ellipsis_char_count;
    ImVec2::ImVec2((ImVec2 *)&i,0.0,0.0);
    RenderTextClippedEx(draw_list,pos_min,&local_ac,text,(char *)pIVar1,(ImVec2 *)&font,(ImVec2 *)&i
                        ,(ImRect *)0x0);
    local_b8 = pos_min->x + local_8c;
    if (local_b8 + text_avail_width <= ellipsis_max_x) {
      for (local_bc = 0; this = pIStack_58, fVar3 = text_end_ellipsis._4_4_, local_bc < (int)glyph;
          local_bc = local_bc + 1) {
        ImVec2::ImVec2(&local_c4,local_b8,pos_min->y);
        col = GetColorU32(0,1.0);
        ImFont::RenderChar(this,draw_list,fVar3,local_c4,col,glyph._6_2_);
        local_b8 = spacing_between_dots + local_b8;
      }
    }
  }
  if ((*(byte *)((long)text_size + 0x2f78) & 1) != 0) {
    LogRenderedText(pos_min,text,(char *)text_size_if_known_local);
  }
  return;
}

Assistant:

void ImGui::RenderTextEllipsis(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, float clip_max_x, float ellipsis_max_x, const char* text, const char* text_end_full, const ImVec2* text_size_if_known)
{
    ImGuiContext& g = *GImGui;
    if (text_end_full == NULL)
        text_end_full = FindRenderedTextEnd(text);
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_end_full, false, 0.0f);

    //draw_list->AddLine(ImVec2(pos_max.x, pos_min.y - 4), ImVec2(pos_max.x, pos_max.y + 4), IM_COL32(0, 0, 255, 255));
    //draw_list->AddLine(ImVec2(ellipsis_max_x, pos_min.y-2), ImVec2(ellipsis_max_x, pos_max.y+2), IM_COL32(0, 255, 0, 255));
    //draw_list->AddLine(ImVec2(clip_max_x, pos_min.y), ImVec2(clip_max_x, pos_max.y), IM_COL32(255, 0, 0, 255));
    // FIXME: We could technically remove (last_glyph->AdvanceX - last_glyph->X1) from text_size.x here and save a few pixels.
    if (text_size.x > pos_max.x - pos_min.x)
    {
        // Hello wo...
        // |       |   |
        // min   max   ellipsis_max
        //          <-> this is generally some padding value

        const ImFont* font = draw_list->_Data->Font;
        const float font_size = draw_list->_Data->FontSize;
        const char* text_end_ellipsis = NULL;

        ImWchar ellipsis_char = font->EllipsisChar;
        int ellipsis_char_count = 1;
        if (ellipsis_char == (ImWchar)-1)
        {
            ellipsis_char = (ImWchar)'.';
            ellipsis_char_count = 3;
        }
        const ImFontGlyph* glyph = font->FindGlyph(ellipsis_char);

        float ellipsis_glyph_width = glyph->X1;                 // Width of the glyph with no padding on either side
        float ellipsis_total_width = ellipsis_glyph_width;      // Full width of entire ellipsis

        if (ellipsis_char_count > 1)
        {
            // Full ellipsis size without free spacing after it.
            const float spacing_between_dots = 1.0f * (draw_list->_Data->FontSize / font->FontSize);
            ellipsis_glyph_width = glyph->X1 - glyph->X0 + spacing_between_dots;
            ellipsis_total_width = ellipsis_glyph_width * (float)ellipsis_char_count - spacing_between_dots;
        }

        // We can now claim the space between pos_max.x and ellipsis_max.x
        const float text_avail_width = ImMax((ImMax(pos_max.x, ellipsis_max_x) - ellipsis_total_width) - pos_min.x, 1.0f);
        float text_size_clipped_x = font->CalcTextSizeA(font_size, text_avail_width, 0.0f, text, text_end_full, &text_end_ellipsis).x;
        if (text == text_end_ellipsis && text_end_ellipsis < text_end_full)
        {
            // Always display at least 1 character if there's no room for character + ellipsis
            text_end_ellipsis = text + ImTextCountUtf8BytesFromChar(text, text_end_full);
            text_size_clipped_x = font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text, text_end_ellipsis).x;
        }
        while (text_end_ellipsis > text && ImCharIsBlankA(text_end_ellipsis[-1]))
        {
            // Trim trailing space before ellipsis (FIXME: Supporting non-ascii blanks would be nice, for this we need a function to backtrack in UTF-8 text)
            text_end_ellipsis--;
            text_size_clipped_x -= font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text_end_ellipsis, text_end_ellipsis + 1).x; // Ascii blanks are always 1 byte
        }

        // Render text, render ellipsis
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_ellipsis, &text_size, ImVec2(0.0f, 0.0f));
        float ellipsis_x = pos_min.x + text_size_clipped_x;
        if (ellipsis_x + ellipsis_total_width <= ellipsis_max_x)
            for (int i = 0; i < ellipsis_char_count; i++)
            {
                font->RenderChar(draw_list, font_size, ImVec2(ellipsis_x, pos_min.y), GetColorU32(ImGuiCol_Text), ellipsis_char);
                ellipsis_x += ellipsis_glyph_width;
            }
    }
    else
    {
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_full, &text_size, ImVec2(0.0f, 0.0f));
    }

    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_end_full);
}